

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_CustomRailgun
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  Angle *this;
  TObjPtr<AActor> *obj;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  AActor *pAVar8;
  double x;
  bool bVar9;
  int iVar10;
  VMValue *pVVar11;
  AActor *pAVar12;
  AActor *pAVar13;
  AActor *other;
  int iVar14;
  char *pcVar15;
  uint32 uVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  void *pvVar20;
  void *pvVar21;
  undefined1 auVar22 [16];
  FTranslatedLineTarget t;
  DVector2 xydiff;
  AActor **local_1b0;
  void *local_1a8;
  int local_1a0;
  uint local_19c;
  int local_198;
  PClassActor *local_190;
  AActor *local_188;
  int local_178;
  DObject *local_160;
  void *local_158;
  DThinker *local_150;
  undefined8 local_148;
  undefined1 local_140 [32];
  AActor *local_120;
  double local_118;
  double local_110;
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  DAngle local_d8 [4];
  AActor *local_b8;
  int iStack_b0;
  undefined4 uStack_ac;
  DObject *local_a8;
  DObject *local_a0;
  uint32 local_98;
  int local_94;
  DThinker *local_90;
  uint local_88;
  AActor *local_80;
  DAngle local_78;
  DAngle local_70;
  double local_68;
  int local_60;
  double local_58;
  void *local_50;
  PClassActor *local_48;
  int local_40;
  int local_3c;
  
  if (numparam < 1) {
    pcVar15 = "(paramnum) < numparam";
    goto LAB_003e0165;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e0117:
    pcVar15 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e0165:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x8cd,
                  "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  other = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_003df6af;
    bVar9 = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
    if (!bVar9) {
      pcVar15 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e0165;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_003e0117;
LAB_003df6af:
    other = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar15 = "(paramnum) < numparam";
LAB_003e018d:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x8ce,
                  "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar15 = "param[paramnum].Type == REGT_INT";
    goto LAB_003e018d;
  }
  iVar6 = param[1].field_0.i;
  if ((uint)numparam < 3) {
    pVVar11 = defaultparam->Array;
    if (pVVar11[2].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003e0351;
    }
    iVar10 = pVVar11[2].field_0.i;
LAB_003df6fb:
    if (pVVar11[3].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e0370:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d0,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar16 = pVVar11[3].field_0.i;
LAB_003df709:
    if (pVVar11[4].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e0320:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d1,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_198 = pVVar11[4].field_0.i;
LAB_003df71e:
    if (pVVar11[5].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e0301:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d2,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_19c = pVVar11[5].field_0.i;
LAB_003df72f:
    if (pVVar11[6].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e02e2:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d3,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar14 = pVVar11[6].field_0.i;
LAB_003df73c:
    if (pVVar11[7].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e02c3:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d4,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_150 = (DThinker *)pVVar11[7].field_0.field_1.a;
LAB_003df751:
    if (pVVar11[8].field_0.field_3.Type != '\x03') {
LAB_003e013f:
      pcVar15 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e0146:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d5,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pAVar13 = (AActor *)pVVar11[8].field_0.field_1.a;
    if (pVVar11[8].field_0.field_1.atag != 1) {
      if (pAVar13 != (AActor *)0x0) goto LAB_003e013f;
      pAVar13 = (AActor *)0x0;
    }
LAB_003df77a:
    if (pVVar11[9].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e02a4:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d6,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar18 = (undefined4)*(undefined8 *)&pVVar11[9].field_0;
    uVar19 = (undefined4)((ulong)*(undefined8 *)&pVVar11[9].field_0 >> 0x20);
LAB_003df78f:
    if (pVVar11[10].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e0285:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d7,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_1a8 = pVVar11[10].field_0.field_1.a;
LAB_003df7a4:
    if (pVVar11[0xb].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e0266:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d8,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pvVar20 = pVVar11[0xb].field_0.field_1.a;
LAB_003df7b9:
    if (pVVar11[0xc].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e0247:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8d9,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar17 = pVVar11[0xc].field_0.i;
LAB_003df7cd:
    if (pVVar11[0xd].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e0228:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8da,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pvVar21 = pVVar11[0xd].field_0.field_1.a;
LAB_003df7e2:
    if (pVVar11[0xe].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e0209:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8db,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_158 = pVVar11[0xe].field_0.field_1.a;
LAB_003df7fd:
    if (pVVar11[0xf].field_0.field_3.Type != '\x03') {
LAB_003e0120:
      pcVar15 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e0127:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8dc,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_190 = (PClassActor *)pVVar11[0xf].field_0.field_1.a;
    if (pVVar11[0xf].field_0.field_1.atag != 1) {
      if (local_190 != (PClassActor *)0x0) goto LAB_003e0120;
      local_190 = (PClassActor *)0x0;
    }
LAB_003df833:
    if (pVVar11[0x10].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003e01ea:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8dd,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_160 = (DObject *)pVVar11[0x10].field_0.field_1.a;
LAB_003df84e:
    if (pVVar11[0x11].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e01cb:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8de,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_1a0 = pVVar11[0x11].field_0.i;
LAB_003df865:
    local_1b0 = (AActor **)CONCAT44(uVar19,uVar18);
    if (pVVar11[0x12].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e01ac:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8df,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
LAB_003e0351:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x8cf,
                    "int AF_AActor_A_CustomRailgun(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar10 = param[2].field_0.i;
    if (numparam == 3) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df6fb;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e0370;
    }
    uVar16 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df709;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e0320;
    }
    local_198 = param[4].field_0.i;
    if (numparam == 5) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df71e;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e0301;
    }
    local_19c = param[5].field_0.i;
    if ((uint)numparam < 7) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df72f;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e02e2;
    }
    iVar14 = param[6].field_0.i;
    if (numparam == 7) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df73c;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e02c3;
    }
    local_150 = (DThinker *)param[7].field_0.field_1.a;
    if ((uint)numparam < 9) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df751;
    }
    if ((param[8].field_0.field_3.Type != '\x03') ||
       (pAVar13 = (AActor *)param[8].field_0.field_1.a,
       pAVar13 != (AActor *)0x0 && param[8].field_0.field_1.atag != 1)) {
      pcVar15 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e0146;
    }
    if (numparam == 9) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df77a;
    }
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e02a4;
    }
    local_1b0 = *(AActor ***)&param[9].field_0;
    uVar18 = SUB84(local_1b0,0);
    uVar19 = (undefined4)((ulong)local_1b0 >> 0x20);
    if ((uint)numparam < 0xb) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df78f;
    }
    if (param[10].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e0285;
    }
    local_1a8 = (void *)param[10].field_0.f;
    if (numparam == 0xb) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df7a4;
    }
    if (param[0xb].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e0266;
    }
    pvVar20 = (void *)param[0xb].field_0.f;
    if ((uint)numparam < 0xd) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df7b9;
    }
    if (param[0xc].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e0247;
    }
    iVar17 = param[0xc].field_0.i;
    if (numparam == 0xd) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df7cd;
    }
    if (param[0xd].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e0228;
    }
    pvVar21 = (void *)param[0xd].field_0.f;
    if ((uint)numparam < 0xf) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df7e2;
    }
    if (param[0xe].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e0209;
    }
    local_158 = param[0xe].field_0.field_1.a;
    if (numparam == 0xf) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df7fd;
    }
    if ((param[0xf].field_0.field_3.Type != '\x03') ||
       (local_190 = (PClassActor *)param[0xf].field_0.field_1.a,
       local_190 != (PClassActor *)0x0 && param[0xf].field_0.field_1.atag != 1)) {
      pcVar15 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e0127;
    }
    if ((uint)numparam < 0x11) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df833;
    }
    if (param[0x10].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003e01ea;
    }
    local_160 = (DObject *)param[0x10].field_0.field_1.a;
    if (numparam == 0x11) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df84e;
    }
    if (param[0x11].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e01cb;
    }
    local_1a0 = param[0x11].field_0.i;
    if ((uint)numparam < 0x13) {
      pVVar11 = defaultparam->Array;
      goto LAB_003df865;
    }
    if (param[0x12].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e01ac;
    }
  }
  local_e8 = (other->__Pos).X;
  dStack_e0 = (other->__Pos).Y;
  local_118 = (other->__Pos).Z;
  local_188 = (AActor *)(other->Angles).Yaw.Degrees;
  local_110 = (other->Angles).Pitch.Degrees;
  dStack_f0 = 0.0;
  if (iVar14 != 0) {
    local_140._16_8_ = 0.0;
    local_140._8_8_ = pvVar21;
    pAVar12 = GC::ReadBarrier<AActor>((AActor **)&other->target);
    pvVar21 = (void *)local_140._8_8_;
    dStack_f0 = (double)local_140._16_8_;
    if (pAVar12 == (AActor *)0x0) {
      return 0;
    }
  }
  auVar22._0_8_ = ~-(ulong)((double)pvVar20 == 0.0) & (ulong)pvVar20;
  auVar22._8_8_ = 0;
  uVar7 = (other->flags).Value;
  if ((uVar7 >> 0x1e & 1) != 0) {
    other->visdir = '\x01';
  }
  local_140._8_4_ = iVar17;
  local_108 = auVar22 | ZEXT416((uint)(-(ulong)((double)pvVar20 == 0.0) >> 0x20) & 0x40c00000) <<
                        0x20;
  local_f8 = (double)(~-(ulong)((double)pvVar21 == 0.0) & (ulong)pvVar21 |
                     -(ulong)((double)pvVar21 == 0.0) & 0x3ff0000000000000);
  this = &(other->Angles).Yaw;
  (other->flags).Value = uVar7 & 0xffffffdf;
  if (iVar14 == 0) {
    local_140._0_8_ = this->Degrees;
    pAVar12 = (AActor *)0x0;
  }
  else {
    pAVar12 = GC::ReadBarrier<AActor>((AActor **)&other->target);
    AActor::AngleTo((AActor *)&stack0xffffffffffffff48,other,SUB81(pAVar12,0));
    (other->Angles).Yaw.Degrees = (double)local_b8;
    local_140._0_8_ = local_b8;
    pAVar8 = (other->target).field_0.p;
    pAVar12 = (AActor *)0x0;
    if ((pAVar8 != (AActor *)0x0) &&
       (pAVar12 = (AActor *)0x0, ((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0))
    {
      pAVar12 = pAVar8;
    }
  }
  local_148 = 0x404e000000000000;
  P_AimLineAttack((AActor *)&stack0xffffffffffffff48,(DAngle *)other,2048.0,
                  (FTranslatedLineTarget *)local_140,local_d8,(int)&local_148,(AActor *)0x0,pAVar12)
  ;
  (other->Angles).Pitch.Degrees = (double)local_b8;
  local_120 = pAVar13;
  if ((iVar14 == 0) || (local_d8[0].Degrees != 0.0)) {
    local_178 = iVar10;
    if (iVar14 == 0) goto LAB_003dfd10;
  }
  else {
    GC::ReadBarrier<AActor>((AActor **)&other->target);
    AActor::Vec2To((AActor *)&stack0xffffffffffffff48,other);
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)&other->target);
    dVar1 = (pAVar13->__Pos).Z;
    dVar2 = pAVar13->Height;
    dVar3 = other->Height;
    dVar4 = (other->__Pos).Z;
    dVar5 = other->Floorclip;
    x = TVector2<double>::Length((TVector2<double> *)&stack0xffffffffffffff48);
    dVar1 = c_atan2(((dVar1 + dVar2 * 0.5) - (dVar4 + dVar3 * 0.5)) - dVar5,x);
    (other->Angles).Pitch.Degrees = dVar1 * -57.29577951308232;
  }
  obj = &other->target;
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
  pAVar12 = GC::ReadBarrier<AActor>((AActor **)obj);
  dVar1 = (pAVar12->Vel).X;
  pAVar12 = GC::ReadBarrier<AActor>((AActor **)obj);
  local_178 = 0;
  AActor::AngleTo((AActor *)&stack0xffffffffffffff48,other,dVar1 * -3.0,(pAVar12->Vel).Y * -3.0,
                  SUB81(pAVar13,0));
  (other->Angles).Yaw.Degrees = (double)local_b8;
  local_188 = local_b8;
  if (iVar14 == 2) {
    local_140._24_8_ = TAngle<double>::Cos(this);
    local_140._24_8_ = (double)local_140._24_8_ * (double)iVar10;
    dVar1 = TAngle<double>::Sin(this);
    AActor::Vec2Offset((AActor *)&stack0xffffffffffffff48,(double)local_140._24_8_,
                       (double)iVar10 * dVar1,SUB81(other,0));
    (other->__Pos).X = (double)local_b8;
    (other->__Pos).Y = (double)CONCAT44(uStack_ac,iStack_b0);
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar12 = GC::ReadBarrier<AActor>((AActor **)obj);
    dVar1 = (pAVar12->Vel).X;
    pAVar12 = GC::ReadBarrier<AActor>((AActor **)obj);
    AActor::AngleTo((AActor *)&stack0xffffffffffffff48,other,dVar1 * -3.0,(pAVar12->Vel).Y * -3.0,
                    SUB81(pAVar13,0));
    (other->Angles).Yaw.Degrees = (double)local_b8;
    iVar10 = local_178;
  }
  local_178 = iVar10;
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (((pAVar13->flags).Value & 0x40000) != 0) {
    iVar10 = FRandom::Random2(&pr_crailgun);
    this->Degrees = (double)iVar10 * 0.17578125 + this->Degrees;
  }
LAB_003dfd10:
  if ((local_19c & 4) == 0) {
    iVar10 = FRandom::Random2(&pr_crailgun);
    local_1b0 = (AActor **)(((double)local_1b0 * (double)iVar10) / 255.0);
    iVar10 = FRandom::Random2(&pr_crailgun);
    local_1a8 = (void *)(((double)local_1a8 * (double)iVar10) / 255.0);
  }
  local_a8 = (DObject *)(double)local_178;
  local_a0 = local_160;
  local_94 = local_198;
  local_90 = local_150;
  local_88 = local_19c;
  local_80 = local_120;
  local_68 = (double)local_108._0_8_;
  local_60 = local_140._8_4_;
  local_58 = local_f8;
  local_50 = local_158;
  local_48 = local_190;
  local_40 = local_1a0;
  local_3c = 0;
  local_b8 = other;
  iStack_b0 = iVar6;
  local_98 = uVar16;
  local_78.Degrees = (double)local_1b0;
  local_70.Degrees = (double)local_1a8;
  P_RailAttack((FRailParams *)&stack0xffffffffffffff48);
  (other->__Pos).Z = local_118;
  (other->__Pos).X = local_e8;
  (other->__Pos).Y = dStack_e0;
  (other->Angles).Yaw.Degrees = (double)local_188;
  (other->Angles).Pitch.Degrees = local_110;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomRailgun)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(damage);
	PARAM_INT_DEF	(spawnofs_xy)		
	PARAM_COLOR_DEF	(color1)			
	PARAM_COLOR_DEF	(color2)			
	PARAM_INT_DEF	(flags)				
	PARAM_INT_DEF	(aim)				
	PARAM_FLOAT_DEF	(maxdiff)			
	PARAM_CLASS_DEF	(pufftype, AActor)	
	PARAM_ANGLE_DEF	(spread_xy)			
	PARAM_ANGLE_DEF	(spread_z)			
	PARAM_FLOAT_DEF	(range)				
	PARAM_INT_DEF	(duration)			
	PARAM_FLOAT_DEF	(sparsity)			
	PARAM_FLOAT_DEF	(driftspeed)		
	PARAM_CLASS_DEF	(spawnclass, AActor)
	PARAM_FLOAT_DEF	(spawnofs_z)		
	PARAM_INT_DEF	(SpiralOffset)		
	PARAM_INT_DEF	(limit)				

	if (range == 0) range = 8192.;
	if (sparsity == 0) sparsity = 1;

	FTranslatedLineTarget t;

	DVector3 savedpos = self->Pos();
	DAngle saved_angle = self->Angles.Yaw;
	DAngle saved_pitch = self->Angles.Pitch;

	if (aim && self->target == NULL)
	{
		return 0;
	}
	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = 1;
	}

	self->flags &= ~MF_AMBUSH;


	if (aim)
	{
		self->Angles.Yaw = self->AngleTo(self->target);
	}
	self->Angles.Pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE, &t, 60., 0, aim ? self->target : NULL);
	if (t.linetarget == NULL && aim)
	{
		// We probably won't hit the target, but aim at it anyway so we don't look stupid.
		DVector2 xydiff = self->Vec2To(self->target);
		double zdiff = self->target->Center() - self->Center() - self->Floorclip;
		self->Angles.Pitch = -VecToAngle(xydiff.Length(), zdiff);
	}
	// Let the aim trail behind the player
	if (aim)
	{
		saved_angle = self->Angles.Yaw = self->AngleTo(self->target, -self->target->Vel.X * 3, -self->target->Vel.Y * 3);

		if (aim == CRF_AIMDIRECT)
		{
			// Tricky: We must offset to the angle of the current position
			// but then change the angle again to ensure proper aim.
			self->SetXY(self->Vec2Offset(
				spawnofs_xy * self->Angles.Yaw.Cos(),
				spawnofs_xy * self->Angles.Yaw.Sin()));
			spawnofs_xy = 0;
			self->Angles.Yaw = self->AngleTo(self->target,- self->target->Vel.X * 3, -self->target->Vel.Y * 3);
		}

		if (self->target->flags & MF_SHADOW)
		{
			DAngle rnd = pr_crailgun.Random2() * (45. / 256.);
			self->Angles.Yaw += rnd;
		}
	}

	if (!(flags & CRF_EXPLICITANGLE))
	{
		spread_xy = spread_xy * pr_crailgun.Random2() / 255;
		spread_z = spread_z * pr_crailgun.Random2() / 255;
	}

	FRailParams p;
	p.source = self;
	p.damage = damage;
	p.offset_xy = spawnofs_xy;
	p.offset_z = spawnofs_z;
	p.color1 = color1;
	p.color2 = color2;
	p.maxdiff = maxdiff;
	p.flags = flags;
	p.puff = pufftype;
	p.angleoffset = spread_xy;
	p.pitchoffset = spread_z;
	p.distance = range;
	p.duration = duration;
	p.sparsity = sparsity;
	p.drift = driftspeed;
	p.spawnclass = spawnclass;
	p.SpiralOffset = SpiralOffset;
	p.limit = 0;
	P_RailAttack(&p);

	self->SetXYZ(savedpos);
	self->Angles.Yaw = saved_angle;
	self->Angles.Pitch = saved_pitch;
	return 0;
}